

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_create(REF_INTERP *ref_interp_ptr,REF_GRID from_grid,REF_GRID to_grid)

{
  bool bVar1;
  uint uVar2;
  REF_BOOL RVar3;
  uint uVar4;
  REF_INTERP ref_interp;
  REF_BOOL *__s;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  REF_STATUS RVar8;
  char *pcVar9;
  ulong uVar10;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG nqua;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar4 = to_grid->node->max;
  uVar10 = (ulong)uVar4;
  ref_interp = (REF_INTERP)malloc(0xb0);
  *ref_interp_ptr = ref_interp;
  if (ref_interp == (REF_INTERP)0x0) {
    pcVar9 = "malloc *ref_interp_ptr of REF_INTERP_STRUCT NULL";
    uVar7 = 0x98;
LAB_0015c458:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
           "ref_interp_create",pcVar9);
    uVar2 = 2;
  }
  else {
    ref_interp->from_grid = from_grid;
    uVar2 = ref_cell_ncell(from_grid->cell[6],from_grid->node,&local_38);
    if (uVar2 == 0) {
      uVar2 = ref_cell_ncell(from_grid->cell[9],from_grid->node,&local_40);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x9f,"ref_interp_create",(ulong)uVar2,"global npyr");
        return uVar2;
      }
      uVar2 = ref_cell_ncell(from_grid->cell[10],from_grid->node,&local_48);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xa1,"ref_interp_create",(ulong)uVar2,"global npri");
        return uVar2;
      }
      uVar2 = ref_cell_ncell(from_grid->cell[0xb],from_grid->node,&local_50);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xa3,"ref_interp_create",(ulong)uVar2,"global nhex");
        return uVar2;
      }
      if ((((local_38 < 1) && (local_40 < 1)) && (local_48 < 1)) && (local_50 < 1)) {
        ref_interp->from_tet = from_grid->cell[8];
        ref_interp->from_tri = from_grid->cell[3];
        RVar3 = 0;
      }
      else {
        uVar2 = ref_shard_extract_tri(from_grid,&ref_interp->from_tri);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xa6,"ref_interp_create",(ulong)uVar2,"shard tri");
          return uVar2;
        }
        uVar2 = ref_shard_extract_tet(from_grid,&ref_interp->from_tet);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xa8,"ref_interp_create",(ulong)uVar2,"shard tet");
          return uVar2;
        }
        RVar3 = 1;
      }
      ref_interp->from_cell_freeable = RVar3;
      ref_interp->to_grid = to_grid;
      ref_interp->ref_mpi = ref_interp->from_grid->mpi;
      ref_interp->instrument = 0;
      ref_interp->continuously = 0;
      ref_interp->n_walk = 0;
      ref_interp->n_terminated = 0;
      ref_interp->walk_steps = 0;
      ref_interp->n_geom = 0;
      ref_interp->n_geom_fail = 0;
      ref_interp->n_tree = 0;
      ref_interp->tree_cells = 0;
      ref_interp->max = uVar4;
      if ((int)uVar4 < 0) {
        bVar1 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xbd,"ref_interp_create","malloc ref_interp->agent_hired of REF_BOOL negative");
        RVar8 = 1;
      }
      else {
        __s = (REF_BOOL *)malloc(uVar10 * 4);
        ref_interp->agent_hired = __s;
        if (__s == (REF_BOOL *)0x0) {
          bVar1 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xbd,"ref_interp_create","malloc ref_interp->agent_hired of REF_BOOL NULL");
          RVar8 = 2;
        }
        else {
          bVar1 = true;
          RVar8 = 0;
          if (uVar4 != 0) {
            memset(__s,0,uVar10 * 4);
          }
        }
      }
      if (!bVar1) {
        return RVar8;
      }
      if ((int)uVar4 < 0) {
        bVar1 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xbe,"ref_interp_create","malloc ref_interp->cell of REF_INT negative");
        RVar8 = 1;
      }
      else {
        pRVar5 = (REF_INT *)malloc(uVar10 * 4);
        ref_interp->cell = pRVar5;
        if (pRVar5 == (REF_INT *)0x0) {
          bVar1 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xbe,"ref_interp_create","malloc ref_interp->cell of REF_INT NULL");
          RVar8 = 2;
        }
        else {
          bVar1 = true;
          if (uVar4 != 0) {
            memset(pRVar5,0xff,uVar10 * 4);
          }
        }
      }
      if (!bVar1) {
        return RVar8;
      }
      if ((int)uVar4 < 0) {
        bVar1 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xbf,"ref_interp_create","malloc ref_interp->part of REF_INT negative");
        RVar8 = 1;
      }
      else {
        pRVar5 = (REF_INT *)malloc(uVar10 * 4);
        ref_interp->part = pRVar5;
        if (pRVar5 == (REF_INT *)0x0) {
          bVar1 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xbf,"ref_interp_create","malloc ref_interp->part of REF_INT NULL");
          RVar8 = 2;
        }
        else {
          bVar1 = true;
          if (uVar4 != 0) {
            memset(pRVar5,0xff,uVar10 * 4);
          }
        }
      }
      if (!bVar1) {
        return RVar8;
      }
      if ((int)uVar4 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xc0,"ref_interp_create","malloc ref_interp->bary of REF_DBL negative");
        return 1;
      }
      pRVar6 = (REF_DBL *)malloc((ulong)(uVar4 << 2) << 3);
      ref_interp->bary = pRVar6;
      if (pRVar6 == (REF_DBL *)0x0) {
        pcVar9 = "malloc ref_interp->bary of REF_DBL NULL";
        uVar7 = 0xc0;
        goto LAB_0015c458;
      }
      ref_interp->inside = -1e-12;
      ref_interp->bound = -0.1;
      uVar4 = ref_agents_create(&ref_interp->ref_agents,ref_interp->ref_mpi);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xc5,"ref_interp_create",(ulong)uVar4,"add agents");
        return uVar4;
      }
      uVar4 = ref_list_create(&ref_interp->visualize);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xc6,"ref_interp_create",(ulong)uVar4,"add list");
        return uVar4;
      }
      ref_interp->search_fuzz = 1e-12;
      ref_interp->search_donor_scale = 2.0;
      uVar2 = ref_interp_create_search(ref_interp);
      if (uVar2 == 0) {
        return 0;
      }
      pcVar9 = "fill search";
      uVar7 = 0xc9;
    }
    else {
      pcVar9 = "global nqua";
      uVar7 = 0x9d;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
           "ref_interp_create",(ulong)uVar2,pcVar9);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_create(REF_INTERP *ref_interp_ptr,
                                     REF_GRID from_grid, REF_GRID to_grid) {
  REF_INTERP ref_interp;
  REF_INT max = ref_node_max(ref_grid_node(to_grid));
  REF_LONG nqua, npyr, npri, nhex;

  ref_malloc(*ref_interp_ptr, 1, REF_INTERP_STRUCT);
  ref_interp = (*ref_interp_ptr);

  ref_interp_from_grid(ref_interp) = from_grid;
  RSS(ref_cell_ncell(ref_grid_qua(from_grid), ref_grid_node(from_grid), &nqua),
      "global nqua");
  RSS(ref_cell_ncell(ref_grid_pyr(from_grid), ref_grid_node(from_grid), &npyr),
      "global npyr");
  RSS(ref_cell_ncell(ref_grid_pri(from_grid), ref_grid_node(from_grid), &npri),
      "global npri");
  RSS(ref_cell_ncell(ref_grid_hex(from_grid), ref_grid_node(from_grid), &nhex),
      "global nhex");
  if (0 < nqua || 0 < npyr || 0 < npri || 0 < nhex) {
    RSS(ref_shard_extract_tri(from_grid, &ref_interp_from_tri(ref_interp)),
        "shard tri");
    RSS(ref_shard_extract_tet(from_grid, &ref_interp_from_tet(ref_interp)),
        "shard tet");
    ref_interp_from_cell_freeable(ref_interp) = REF_TRUE;
  } else {
    ref_interp_from_tet(ref_interp) = ref_grid_tet(from_grid);
    ref_interp_from_tri(ref_interp) = ref_grid_tri(from_grid);
    ref_interp_from_cell_freeable(ref_interp) = REF_FALSE;
  }
  ref_interp_to_grid(ref_interp) = to_grid;

  ref_interp_mpi(ref_interp) = ref_grid_mpi(ref_interp_from_grid(ref_interp));

  ref_interp->instrument = REF_FALSE;
  ref_interp->continuously = REF_FALSE;
  ref_interp->n_walk = 0;
  ref_interp->n_terminated = 0;
  ref_interp->walk_steps = 0;
  ref_interp->n_geom = 0;
  ref_interp->n_geom_fail = 0;
  ref_interp->n_tree = 0;
  ref_interp->tree_cells = 0;
  ref_interp_max(ref_interp) = max;
  ref_malloc_init(ref_interp->agent_hired, max, REF_BOOL, REF_FALSE);
  ref_malloc_init(ref_interp->cell, max, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_interp->part, max, REF_INT, REF_EMPTY);
  ref_malloc(ref_interp->bary, 4 * max, REF_DBL);
  ref_interp->inside = -1.0e-12; /* inside tolerance */
  ref_interp->bound = -0.1;      /* bound tolerance */

  RSS(ref_agents_create(&(ref_interp->ref_agents), ref_interp_mpi(ref_interp)),
      "add agents");
  RSS(ref_list_create(&(ref_interp->visualize)), "add list");
  ref_interp_search_fuzz(ref_interp) = 1.0e-12;
  ref_interp_search_donor_scale(ref_interp) = 2.0;
  RSS(ref_interp_create_search(ref_interp), "fill search");

  return REF_SUCCESS;
}